

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

int pybind11_getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  long *plVar1;
  long *plVar2;
  tuple_iterator tVar3;
  type_info *ptVar4;
  buffer_info *this;
  ssize_t sVar5;
  char *pcVar6;
  long *plVar7;
  sequence_fast_readonly sVar8;
  handle local_38;
  
  local_38.m_ptr = obj->ob_type->tp_mro;
  if (local_38.m_ptr != (PyObject *)0x0) {
    (local_38.m_ptr)->ob_refcnt = (local_38.m_ptr)->ob_refcnt + 1;
  }
  sVar8.ptr = (PyObject **)&local_38.m_ptr[1].ob_type;
  if (((local_38.m_ptr)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar8.ptr = (PyObject **)*sVar8.ptr;
  }
  tVar3 = pybind11::tuple::end((tuple *)&local_38);
  ptVar4 = (type_info *)0x0;
  while (((sequence_fast_readonly)sVar8.ptr != tVar3.super_sequence_fast_readonly.ptr &&
         ((ptVar4 = pybind11::detail::get_type_info((PyTypeObject *)*sVar8.ptr),
          ptVar4 == (type_info *)0x0 ||
          (ptVar4->get_buffer == (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0))))) {
    sVar8.ptr = sVar8.ptr + 1;
  }
  pybind11::object::~object((object *)&local_38);
  if ((view == (Py_buffer *)0x0) || (ptVar4 == (type_info *)0x0)) {
    if (view != (Py_buffer *)0x0) goto LAB_00121543;
  }
  else {
    if (ptVar4->get_buffer != (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0) {
      view->suboffsets = (Py_ssize_t *)0x0;
      view->internal = (void *)0x0;
      view->shape = (Py_ssize_t *)0x0;
      view->strides = (Py_ssize_t *)0x0;
      view->readonly = 0;
      view->ndim = 0;
      view->format = (char *)0x0;
      view->len = 0;
      view->itemsize = 0;
      view->buf = (void *)0x0;
      view->obj = (PyObject *)0x0;
      this = (*ptVar4->get_buffer)(obj,ptVar4->get_buffer_data);
      if (((flags & 1U) == 0) || (this->readonly != true)) {
        view->obj = obj;
        view->ndim = 1;
        view->internal = this;
        view->buf = this->ptr;
        sVar5 = this->itemsize;
        view->itemsize = sVar5;
        view->len = sVar5;
        plVar2 = (this->shape).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        plVar1 = (this->shape).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (plVar7 = plVar1; plVar7 != plVar2; plVar7 = plVar7 + 1) {
          sVar5 = sVar5 * *plVar7;
          view->len = sVar5;
        }
        view->readonly = (uint)this->readonly;
        if ((flags & 4U) != 0) {
          view->format = (this->format)._M_dataplus._M_p;
        }
        if ((~flags & 0x18U) == 0) {
          view->ndim = (int)this->ndim;
          view->strides =
               (this->strides).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
          view->shape = plVar1;
        }
        obj->ob_refcnt = obj->ob_refcnt + 1;
        return 0;
      }
      pybind11::buffer_info::~buffer_info(this);
      operator_delete(this,0x88);
      pcVar6 = "Writable buffer requested for readonly storage";
      goto LAB_00121559;
    }
LAB_00121543:
    view->obj = (PyObject *)0x0;
  }
  pcVar6 = "pybind11_getbuffer(): Internal error";
LAB_00121559:
  PyErr_SetString(_PyExc_BufferError,pcVar6);
  return -1;
}

Assistant:

inline int pybind11_getbuffer(PyObject *obj, Py_buffer *view, int flags) {
    // Look for a `get_buffer` implementation in this type's info or any bases (following MRO).
    type_info *tinfo = nullptr;
    for (auto type : reinterpret_borrow<tuple>(Py_TYPE(obj)->tp_mro)) {
        tinfo = get_type_info((PyTypeObject *) type.ptr());
        if (tinfo && tinfo->get_buffer)
            break;
    }
    if (view == nullptr || !tinfo || !tinfo->get_buffer) {
        if (view)
            view->obj = nullptr;
        PyErr_SetString(PyExc_BufferError, "pybind11_getbuffer(): Internal error");
        return -1;
    }
    std::memset(view, 0, sizeof(Py_buffer));
    buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
    if ((flags & PyBUF_WRITABLE) == PyBUF_WRITABLE && info->readonly) {
        delete info;
        // view->obj = nullptr;  // Was just memset to 0, so not necessary
        PyErr_SetString(PyExc_BufferError, "Writable buffer requested for readonly storage");
        return -1;
    }
    view->obj = obj;
    view->ndim = 1;
    view->internal = info;
    view->buf = info->ptr;
    view->itemsize = info->itemsize;
    view->len = view->itemsize;
    for (auto s : info->shape)
        view->len *= s;
    view->readonly = info->readonly;
    if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT)
        view->format = const_cast<char *>(info->format.c_str());
    if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
        view->ndim = (int) info->ndim;
        view->strides = &info->strides[0];
        view->shape = &info->shape[0];
    }
    Py_INCREF(view->obj);
    return 0;
}